

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::Print
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *this,ostream *out)

{
  TPZCompEl *this_00;
  int iVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  TPZGeoEl *pTVar5;
  TPZGeoEl *pTVar6;
  long lVar7;
  _List_node_base *p_Var8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> restraints;
  double local_1098;
  TPZVec<double> centerMaster;
  
  poVar3 = std::operator<<(out,
                           "virtual void TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::Print(std::ostream &) const [TGeometry = pzgeom::TPZGeoTetrahedra]"
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  TPZCompEl::Print((TPZCompEl *)this,out);
  std::operator<<(out,"Integration rule ");
  plVar4 = (long *)(**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl +
                               0x240))(this);
  (**(code **)(*plVar4 + 0x60))(plVar4,out);
  pTVar5 = TPZCompEl::Reference((TPZCompEl *)this);
  if (pTVar5 != (TPZGeoEl *)0x0) {
    std::operator<<(out,"\nCenter coordinate: ");
    pTVar5 = TPZCompEl::Reference((TPZCompEl *)this);
    iVar1 = (**(code **)(*(long *)pTVar5 + 0x210))(pTVar5);
    restraints.super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>._M_impl
    ._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    TPZVec<double>::TPZVec(&centerMaster,(long)iVar1,(double *)&restraints);
    local_1098 = 0.0;
    TPZVec<double>::TPZVec((TPZVec<double> *)&restraints,3,&local_1098);
    pTVar5 = TPZCompEl::Reference((TPZCompEl *)this);
    pTVar6 = TPZCompEl::Reference((TPZCompEl *)this);
    iVar1 = (**(code **)(*(long *)pTVar6 + 0xf0))(pTVar6);
    (**(code **)(*(long *)pTVar5 + 0x260))(pTVar5,iVar1 + -1,&centerMaster);
    pTVar5 = TPZCompEl::Reference((TPZCompEl *)this);
    (**(code **)(*(long *)pTVar5 + 0x228))(pTVar5,&centerMaster,&restraints);
    poVar3 = ::operator<<(out,(TPZVec<double> *)&restraints);
    std::endl<char,std::char_traits<char>>(poVar3);
    TPZVec<double>::~TPZVec((TPZVec<double> *)&restraints);
    TPZVec<double>::~TPZVec(&centerMaster);
  }
  lVar7 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))(this)
  ;
  if (lVar7 == 0) {
    pcVar11 = "No material\n";
    poVar3 = out;
  }
  else {
    poVar3 = std::operator<<(out,"Material id ");
    plVar4 = (long *)(**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl +
                                 0xb8))(this);
    iVar1 = (**(code **)(*plVar4 + 0x58))(plVar4);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    pcVar11 = "\n";
  }
  std::operator<<(poVar3,pcVar11);
  poVar3 = std::operator<<(out,"Number of connects = ");
  iVar1 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x90))(this)
  ;
  std::ostream::operator<<(poVar3,iVar1);
  std::operator<<(out,"Connect indexes : ");
  iVar1 = 0;
  while( true ) {
    iVar2 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x90))
                      (this);
    if (iVar2 <= iVar1) break;
    (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xa0))(this,iVar1)
    ;
    poVar3 = std::ostream::_M_insert<long>((long)out);
    std::operator<<(poVar3,' ');
    iVar1 = iVar1 + 1;
  }
  pTVar5 = TPZCompEl::Reference((TPZCompEl *)this);
  if (pTVar5 != (TPZGeoEl *)0x0) {
    poVar3 = std::operator<<(out,"Reference Index = ");
    TPZCompEl::Reference((TPZCompEl *)this);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x1a0))
            ((_List_node_base *)&restraints,this);
  if (restraints.super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
      _M_impl._M_node._M_size != 0) {
    std::operator<<(out,"One shape restraints\n");
    p_Var8 = (_List_node_base *)&restraints;
    while (p_Var8 = (((_List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
                     &p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var8 != (_List_node_base *)&restraints) {
      TPZOneShapeRestraint::Print((TPZOneShapeRestraint *)(p_Var8 + 1),out);
    }
  }
  std::operator<<(out,"\nComputational elements within multi-physics element: \n");
  lVar7 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
  lVar12 = 0;
  if (lVar7 < 1) {
    lVar7 = lVar12;
  }
  lVar9 = 0;
  for (lVar10 = 0; lVar7 != lVar10; lVar10 = lVar10 + 1) {
    poVar3 = std::operator<<(out,"\nComputational element belonging to the mesh ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3,":\n");
    this_00 = *(TPZCompEl **)
               ((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar12);
    if (this_00 == (TPZCompEl *)0x0) {
      poVar3 = std::operator<<(out,"\n There is not element to computational mesh ");
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::operator<<(poVar3,"\n");
    }
    else {
      (**(code **)(*(long *)this_00 + 200))(this_00,out);
      pTVar5 = TPZCompEl::Reference(this_00);
      if (pTVar5 != (TPZGeoEl *)0x0) {
        poVar3 = std::operator<<(out,"\tReference Index = ");
        TPZCompEl::Reference(this_00);
        std::ostream::_M_insert<long>((long)poVar3);
        TPZManVector<TPZTransform<double>,_10>::TPZManVector
                  ((TPZManVector<TPZTransform<double>,_10> *)&centerMaster,0);
        (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x280))
                  (this,(TPZManVector<TPZTransform<double>,_10> *)&centerMaster);
        poVar3 = std::operator<<(out,
                                 "\n\tAffine transformation of the multiphysics element for this computational element:"
                                );
        std::operator<<(poVar3,"\n");
        std::endl<char,std::char_traits<char>>(out);
        poVar3 = std::operator<<(out,"\t");
        ::operator<<(poVar3,(TPZTransform<double> *)((long)centerMaster.fStore + lVar9));
        TPZManVector<TPZTransform<double>,_10>::~TPZManVector
                  ((TPZManVector<TPZTransform<double>,_10> *)&centerMaster);
      }
    }
    lVar9 = lVar9 + 0x1a0;
    lVar12 = lVar12 + 0x10;
  }
  std::__cxx11::_List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::_M_clear
            (&restraints.
              super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::Print(std::ostream & out) const {
    
    out << __PRETTY_FUNCTION__ << std::endl;
    TPZCompEl::Print(out);
    out << "Integration rule ";
    GetIntegrationRule().Print(out);
    if(this->Reference())
    {
        out << "\nCenter coordinate: ";
        TPZVec< REAL > centerMaster( this->Reference()->Dimension(),0. );
        TPZVec< REAL > centerEuclid( 3,0.);
        this->Reference()->CenterPoint(this->Reference()->NSides()-1,centerMaster);
        this->Reference()->X(centerMaster,centerEuclid);
        out << centerEuclid << std::endl;
    }
    if(this->Material())
    {
        out << "Material id " << this->Material()->Id() << "\n";
    }
    else {
        out << "No material\n";
    }
    
    out << "Number of connects = " << NConnects();
    out << "Connect indexes : ";
    int nod;
    for(nod=0; nod< NConnects(); nod++)
    {
        out << ConnectIndex(nod) <<  ' ' ;
    }
    if(this->Reference())
    {
        out << "Reference Index = " << this->Reference()->Index() << std::endl;
    }
    std::list<TPZOneShapeRestraint> restraints = this->GetShapeRestraints();
    if(restraints.size())
    {
        out << "One shape restraints\n";
        for (std::list<TPZOneShapeRestraint>::const_iterator it = restraints.begin(); it != restraints.end(); it++) {
            it->Print(out);
        }
    }
    
    out << "\nComputational elements within multi-physics element: \n";
    int64_t nmesh  = fElementVec.size();
    for(int64_t iel = 0; iel< nmesh; iel++ ){
        
        out << "\nComputational element belonging to the mesh " << iel <<":\n";
        TPZCompEl *cel = fElementVec[iel].Element();
        if(!cel){
            out << "\n There is not element to computational mesh " << iel <<"\n";
            continue;
        }
        cel->Print(out);
        if(!cel->Reference()) continue;
        out << "\tReference Index = " << cel->Reference()->Index();
        
        TPZManVector<TPZTransform<> > tr;
        AffineTransform(tr);
        out << "\n\tAffine transformation of the multiphysics element for this computational element:"<<"\n";
        out << std::endl;
        out <<"\t" << tr[iel];
    }
}